

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O0

int Saig_ManSimDataInit(Aig_Man_t *p,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo,Vec_Int_t *vRes)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj_00;
  int local_50;
  int iBit;
  int Entry;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Int_t *vRes_local;
  Vec_Ptr_t *vSimInfo_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *p_local;
  
  local_50 = 0;
  for (Entry = 0; iVar1 = Saig_ManRegNum(p), Entry < iVar1; Entry = Entry + 1) {
    p_00 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,Entry + iVar1);
    iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_50);
    iVar1 = 1;
    if (iVar2 != 0) {
      iVar1 = 2;
    }
    Saig_ManSimInfoSet(vSimInfo,pAVar3,0,iVar1);
    local_50 = local_50 + 1;
  }
  for (iBit = 0; iBit <= pCex->iFrame; iBit = iBit + 1) {
    pAVar3 = Aig_ManConst1(p);
    Saig_ManSimInfoSet(vSimInfo,pAVar3,iBit,2);
    for (Entry = 0; iVar1 = Saig_ManPiNum(p), Entry < iVar1; Entry = Entry + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,Entry);
      iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_50);
      iVar1 = 1;
      if (iVar2 != 0) {
        iVar1 = 2;
      }
      Saig_ManSimInfoSet(vSimInfo,pAVar3,iBit,iVar1);
      local_50 = local_50 + 1;
    }
    if (vRes != (Vec_Int_t *)0x0) {
      for (Entry = 0; iVar1 = Vec_IntSize(vRes), Entry < iVar1; Entry = Entry + 1) {
        iVar1 = Vec_IntEntry(vRes,Entry);
        pAVar3 = Aig_ManCi(p,iVar1);
        Saig_ManSimInfoSet(vSimInfo,pAVar3,iBit,3);
      }
    }
    for (Entry = 0; iVar1 = Vec_PtrSize(p->vObjs), Entry < iVar1; Entry = Entry + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,Entry);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
        Saig_ManExtendOneEval(vSimInfo,pAVar3,iBit);
      }
    }
    for (Entry = 0; iVar1 = Vec_PtrSize(p->vCos), Entry < iVar1; Entry = Entry + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Entry);
      Saig_ManExtendOneEval(vSimInfo,pAVar3,iBit);
    }
    if (iBit == pCex->iFrame) break;
    for (Entry = 0; iVar1 = Saig_ManRegNum(p), Entry < iVar1; Entry = Entry + 1) {
      pAVar3 = Saig_ManLi(p,Entry);
      pObj_00 = Saig_ManLo(p,Entry);
      iVar1 = Saig_ManSimInfoGet(vSimInfo,pAVar3,iBit);
      Saig_ManSimInfoSet(vSimInfo,pObj_00,iBit + 1,iVar1);
    }
  }
  pAVar3 = Aig_ManCo(p,pCex->iPo);
  iVar1 = Saig_ManSimInfoGet(vSimInfo,pAVar3,pCex->iFrame);
  return iVar1;
}

Assistant:

int Saig_ManSimDataInit( Aig_Man_t * p, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo, Vec_Int_t * vRes )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f, Entry, iBit = 0;
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSimInfoSet( vSimInfo, pObj, 0, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE:SAIG_ZER );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Saig_ManSimInfoSet( vSimInfo, Aig_ManConst1(p), f, SAIG_ONE );
        Saig_ManForEachPi( p, pObj, i )
            Saig_ManSimInfoSet( vSimInfo, pObj, f, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE:SAIG_ZER );
        if ( vRes )
        Vec_IntForEachEntry( vRes, Entry, i )
            Saig_ManSimInfoSet( vSimInfo, Aig_ManCi(p, Entry), f, SAIG_UND );
        Aig_ManForEachNode( p, pObj, i )
            Saig_ManExtendOneEval( vSimInfo, pObj, f );
        Aig_ManForEachCo( p, pObj, i )
            Saig_ManExtendOneEval( vSimInfo, pObj, f );
        if ( f == pCex->iFrame )
            break;
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Saig_ManSimInfoSet( vSimInfo, pObjLo, f+1, Saig_ManSimInfoGet(vSimInfo, pObjLi, f) );
    }
    // make sure the output of the property failed
    pObj = Aig_ManCo( p, pCex->iPo );
    return Saig_ManSimInfoGet( vSimInfo, pObj, pCex->iFrame );
}